

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAcurv::VariablesQbSetSpeed(ChNodeFEAcurv *this,double step)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  ChVectorRef local_a8;
  long local_90 [3];
  ChVectorRef *local_78;
  undefined8 local_70;
  long local_60;
  double local_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  double dStack_38;
  double dStack_30;
  double dStack_28;
  double dStack_20;
  
  local_58 = (this->m_rxx_dt).m_data[0];
  dStack_50 = (this->m_rxx_dt).m_data[1];
  dStack_48 = (this->m_rxx_dt).m_data[2];
  dStack_40 = (this->m_ryy_dt).m_data[0];
  dStack_38 = (this->m_ryy_dt).m_data[1];
  dStack_30 = (this->m_ryy_dt).m_data[2];
  dStack_28 = (this->m_rzz_dt).m_data[0];
  dStack_20 = (this->m_rzz_dt).m_data[1];
  dVar1 = (this->m_rzz_dt).m_data[2];
  ChVariables::Get_qb(&local_a8,*(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
  local_90[0] = local_a8.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._0_8_;
  local_90[1] = 3;
  local_70 = 0;
  local_60 = local_a8.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._8_8_;
  if (2 < (long)local_a8.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_) {
    local_78 = &local_a8;
    ChVector<double>::operator=
              (&this->m_rxx_dt,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)local_90);
    ChVariables::Get_qb(&local_a8,*(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
    local_90[0] = local_a8.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._0_8_ + 0x18;
    local_90[1] = 3;
    local_70 = 3;
    local_60 = local_a8.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._8_8_;
    if (5 < (long)local_a8.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._8_8_) {
      local_78 = &local_a8;
      ChVector<double>::operator=
                (&this->m_ryy_dt,
                 (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                  *)local_90);
      ChVariables::Get_qb(&local_a8,*(ChVariables **)&(this->super_ChNodeFEAbase).field_0x18);
      local_90[0] = local_a8.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ._0_8_ + 0x30;
      local_90[1] = 3;
      local_70 = 6;
      local_60 = local_a8.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._8_8_;
      if (8 < (long)local_a8.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ._8_8_) {
        local_78 = &local_a8;
        ChVector<double>::operator=
                  (&this->m_rzz_dt,
                   (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                    *)local_90);
        if ((step != 0.0) || (NAN(step))) {
          auVar3._0_24_ = *(undefined1 (*) [24])&this->m_rxx_dt;
          auVar3._24_24_ = *(undefined1 (*) [24])&this->m_ryy_dt;
          auVar3._48_8_ = (this->m_rzz_dt).m_data[0];
          auVar3._56_8_ = (this->m_rzz_dt).m_data[1];
          auVar4._8_8_ = dStack_50;
          auVar4._0_8_ = local_58;
          auVar4._16_8_ = dStack_48;
          auVar4._24_8_ = dStack_40;
          auVar4._32_8_ = dStack_38;
          auVar4._40_8_ = dStack_30;
          auVar4._48_8_ = dStack_28;
          auVar4._56_8_ = dStack_20;
          auVar3 = vsubpd_avx512f(auVar3,auVar4);
          auVar5._0_8_ = 1.0 / step;
          auVar5._8_8_ = 0;
          dVar2 = (this->m_rzz_dt).m_data[2];
          auVar4 = vbroadcastsd_avx512f(auVar5);
          auVar3 = vmulpd_avx512f(auVar4,auVar3);
          this->m_rxx_dtdt = (ChVector<double>)auVar3._0_24_;
          this->m_ryy_dtdt = (ChVector<double>)auVar3._24_24_;
          (this->m_rzz_dtdt).m_data[0] = (double)auVar3._48_8_;
          (this->m_rzz_dtdt).m_data[1] = (double)auVar3._56_8_;
          (this->m_rzz_dtdt).m_data[2] = auVar5._0_8_ * (dVar2 - dVar1);
        }
        return;
      }
    }
  }
  local_90[1] = 3;
  local_78 = &local_a8;
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAcurv::VariablesQbSetSpeed(double step) {
    ChVector<> old_rxx_dt = m_rxx_dt;
    ChVector<> old_ryy_dt = m_ryy_dt;
    ChVector<> old_rzz_dt = m_rzz_dt;

    m_rxx_dt = m_variables->Get_qb().segment(0, 3);
    m_ryy_dt = m_variables->Get_qb().segment(3, 3);
    m_rzz_dt = m_variables->Get_qb().segment(6, 3);

    if (step) {
        m_rxx_dtdt = (m_rxx_dt - old_rxx_dt) / step;
        m_ryy_dtdt = (m_ryy_dt - old_ryy_dt) / step;
        m_rzz_dtdt = (m_rzz_dt - old_rzz_dt) / step;
    }
}